

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renaming.cpp
# Opt level: O1

TypedTermList __thiscall Kernel::Renaming::normalize(Renaming *this,TypedTermList l)

{
  TermList t;
  TypedTermList TVar1;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> n;
  Applicator a;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_30;
  _Head_base<0UL,_Kernel::Renaming_*,_false> local_20;
  
  t = l.super_TermList._content;
  if (((ulong)this & 3) == 0) {
    this = (Renaming *)normalize((Term *)this);
    t = SortHelper::getResultSort((Term *)this);
  }
  else {
    ::Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
              (&local_30);
    normalizeVariables((Renaming *)
                       local_30._self._M_t.
                       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                       .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,(TermList)this
                      );
    normalizeVariables((Renaming *)
                       local_30._self._M_t.
                       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                       .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,t);
    if (*(bool *)((long)local_30._self._M_t.
                        super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                        .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl + 0x2c) ==
        false) {
      local_20._M_head_impl =
           (Renaming *)
           local_30._self._M_t.
           super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
           super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
           super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl;
      this = (Renaming *)
             SubstHelper::applyImpl<false,Kernel::Renaming::Applicator>
                       ((TermList)this,(Applicator *)&local_20,false);
    }
    if (*(bool *)((long)local_30._self._M_t.
                        super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                        .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl + 0x2c) ==
        false) {
      local_20._M_head_impl =
           (Renaming *)
           local_30._self._M_t.
           super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
           super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
           super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl;
      t = SubstHelper::applyImpl<false,Kernel::Renaming::Applicator>
                    (t,(Applicator *)&local_20,false);
    }
    ::Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
              (&local_30);
  }
  TVar1._sort._content = t._content;
  TVar1.super_TermList._content = (uint64_t)this;
  return TVar1;
}

Assistant:

TypedTermList Renaming::normalize(TypedTermList l)
{
  if (l.isTerm()) {
    return TypedTermList(normalize(l.term()));
  } else {
    Recycled<Renaming> n;
    n->normalizeVariables(TermList(l));
    n->normalizeVariables(l.sort());
    return TypedTermList(n->apply(TermList(l)), n->apply(l.sort()));
  }
}